

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxs.cpp
# Opt level: O0

PAL_ERROR AllocatePalThread(CPalThread **ppThread)

{
  HANDLE local_28;
  HANDLE hThread;
  CPalThread *pCStack_18;
  PAL_ERROR palError;
  CPalThread *pThread;
  CPalThread **ppThread_local;
  
  pCStack_18 = (CPalThread *)0x0;
  pThread = (CPalThread *)ppThread;
  hThread._4_4_ = CorUnix::CreateThreadData(&stack0xffffffffffffffe8);
  if (hThread._4_4_ == 0) {
    hThread._4_4_ = CorUnix::CreateThreadObject(pCStack_18,pCStack_18,&local_28);
    if (hThread._4_4_ == 0) {
      (**(code **)(*CorUnix::g_pObjectManager + 0x20))
                (CorUnix::g_pObjectManager,pCStack_18,local_28);
      CorUnix::PROCAddThread(pCStack_18,pCStack_18);
    }
    else {
      pthread_setspecific(CorUnix::thObjKey,(void *)0x0);
      CorUnix::CPalThread::ReleaseThreadReference(pCStack_18);
    }
  }
  pThread->_vptr_CPalThread = (_func_int **)pCStack_18;
  return hThread._4_4_;
}

Assistant:

PAL_ERROR
AllocatePalThread(CPalThread **ppThread)
{
    CPalThread *pThread = NULL;

    PAL_ERROR palError = CreateThreadData(&pThread);
    if (NO_ERROR != palError)
    {
        goto exit;
    }

    HANDLE hThread;
    palError = CreateThreadObject(pThread, pThread, &hThread);
    if (NO_ERROR != palError)
    {
        pthread_setspecific(thObjKey, NULL);
        pThread->ReleaseThreadReference();
        goto exit;
    }

    // Like CreateInitialProcessAndThreadObjects, we do not need this
    // thread handle, since we're not returning it to anyone who will
    // possibly release it.
    (void)g_pObjectManager->RevokeHandle(pThread, hThread);

    PROCAddThread(pThread, pThread);

exit:
    *ppThread = pThread;
    return palError;
}